

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_ssse3.c
# Opt level: O0

void aom_quantize_b_64x64_ssse3
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  __m128i zero_00;
  __m128i zero_01;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  longlong lVar40;
  longlong lVar41;
  longlong lVar42;
  longlong lVar43;
  int16_t iVar44;
  undefined8 *in_RCX;
  long lVar45;
  undefined8 *in_RDX;
  longlong extraout_RDX;
  tran_low_t *coeff_ptr_00;
  tran_low_t *coeff_ptr_01;
  longlong extraout_RDX_00;
  tran_low_t *coeff_ptr_02;
  tran_low_t *coeff_ptr_03;
  longlong extraout_RDX_03;
  __m128i *in_RSI;
  tran_low_t *in_RDI;
  __m128i *coeff0_00;
  undefined8 *in_R8;
  __m128i *in_R9;
  ushort uVar47;
  short sVar48;
  short sVar49;
  ushort uVar52;
  ushort uVar55;
  ushort uVar58;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  short sVar53;
  short sVar54;
  short sVar56;
  short sVar57;
  short sVar59;
  short sVar60;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  ushort uVar65;
  ushort uVar68;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  short sVar64;
  short sVar66;
  short sVar67;
  short sVar69;
  short sVar70;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  longlong extraout_XMM0_Qb_04;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i alVar83;
  __m128i round_00;
  __m128i round_01;
  __m128i round_02;
  __m128i quant_00;
  __m128i quant_01;
  __m128i quant_02;
  __m128i quant_03;
  __m128i coeff_vals;
  __m128i coeff_vals_00;
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i coeff_vals_01;
  __m128i coeff_vals_02;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i eob_00;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i zbin_mask0;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i zbin_mask0_00;
  __m128i zero_02;
  __m128i zero_03;
  __m128i zbin_mask1;
  __m128i zero_04;
  __m128i zero_05;
  __m128i zbin_mask1_00;
  undefined8 *in_stack_00000008;
  __m128i eob0;
  __m128i eob;
  __m128i all_zero;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  int index;
  __m128i two;
  __m128i one;
  __m128i zero;
  longlong *in_stack_fffffffffffff818;
  int in_stack_fffffffffffff820;
  longlong in_stack_fffffffffffff828;
  longlong in_stack_fffffffffffff830;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  __m128i local_788;
  __m128i local_778;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  longlong local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined4 uStack_6f8;
  int local_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  tran_low_t *local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined2 local_674;
  undefined2 local_672;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined4 local_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4cc;
  longlong local_4c8;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4ac;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_48c;
  undefined8 local_488;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_46c;
  undefined8 local_468;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_44c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_42c;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_40c;
  undefined8 local_408;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3ec;
  undefined8 local_3e8;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3cc;
  ulong local_3c8;
  ulong uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_168;
  undefined8 uStack_160;
  longlong local_158;
  longlong lStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  longlong local_138;
  longlong lStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  longlong local_118;
  longlong lStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  longlong local_f8;
  longlong lStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  longlong lStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_04;
  longlong *plVar46;
  undefined8 uVar82;
  
  local_688 = 0;
  uStack_680 = 0;
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_672 = 1;
  local_2a = 1;
  local_2c = 1;
  local_2e = 1;
  local_30 = 1;
  local_32 = 1;
  local_34 = 1;
  local_36 = 1;
  local_38 = 1;
  local_6d8 = 0x1000100010001;
  uStack_6d0 = 0x1000100010001;
  local_674 = 2;
  local_2 = 2;
  local_4 = 2;
  local_6 = 2;
  local_8 = 2;
  local_a = 2;
  local_c = 2;
  local_e = 2;
  local_10 = 2;
  local_6e8 = 0x2000200020002;
  uStack_6e0 = 0x2000200020002;
  local_7c8 = 0;
  uStack_7c0 = 0;
  uVar82 = *in_RDX;
  uVar28 = in_RDX[1];
  uVar29 = *in_RCX;
  uVar30 = in_RCX[1];
  local_728 = *in_R8;
  uStack_720 = in_R8[1];
  local_738 = *(undefined8 *)eob0[1];
  uStack_730 = *(undefined8 *)(eob0[1] + 8);
  local_748 = (*in_R9)[0];
  uStack_740 = (*in_R9)[1];
  local_618._0_2_ = (short)uVar82;
  local_618._2_2_ = (short)((ulong)uVar82 >> 0x10);
  local_618._4_2_ = (short)((ulong)uVar82 >> 0x20);
  local_618._6_2_ = (short)((ulong)uVar82 >> 0x30);
  uStack_610._0_2_ = (short)uVar28;
  uStack_610._2_2_ = (short)((ulong)uVar28 >> 0x10);
  uStack_610._4_2_ = (short)((ulong)uVar28 >> 0x20);
  uStack_610._6_2_ = (short)((ulong)uVar28 >> 0x30);
  local_708._0_4_ = CONCAT22(local_618._2_2_ + 2U,(short)local_618 + 2U);
  local_708._0_6_ = CONCAT24(local_618._4_2_ + 2U,(undefined4)local_708);
  local_708 = CONCAT26(local_618._6_2_ + 2U,(undefined6)local_708);
  uStack_700._0_4_ = CONCAT22(uStack_610._2_2_ + 2U,(short)uStack_610 + 2U);
  uStack_700._0_6_ = CONCAT24(uStack_610._4_2_ + 2U,(undefined4)uStack_700);
  uStack_700 = CONCAT26(uStack_610._6_2_ + 2U,(undefined6)uStack_700);
  local_638._0_2_ = (short)uVar29;
  local_638._2_2_ = (short)((ulong)uVar29 >> 0x10);
  local_638._4_2_ = (short)((ulong)uVar29 >> 0x20);
  local_638._6_2_ = (short)((ulong)uVar29 >> 0x30);
  uStack_630._0_2_ = (short)uVar30;
  uStack_630._2_2_ = (short)((ulong)uVar30 >> 0x10);
  uStack_630._4_2_ = (short)((ulong)uVar30 >> 0x20);
  uStack_630._6_2_ = (short)((ulong)uVar30 >> 0x30);
  local_718._0_4_ = CONCAT22(local_638._2_2_ + 2U,(short)local_638 + 2U);
  local_718._0_6_ = CONCAT24(local_638._4_2_ + 2U,(undefined4)local_718);
  local_718 = CONCAT26(local_638._6_2_ + 2U,(undefined6)local_718);
  uStack_710._0_4_ = CONCAT22(uStack_630._2_2_ + 2U,(short)uStack_630 + 2U);
  uStack_710._0_6_ = CONCAT24(uStack_630._4_2_ + 2U,(undefined4)uStack_710);
  uStack_710 = CONCAT26(uStack_630._6_2_ + 2U,(undefined6)uStack_710);
  local_5d8 = local_708;
  uStack_5d0 = uStack_700;
  local_5dc = 2;
  uVar47 = (ushort)((short)local_618 + 2U) >> 2;
  uVar52 = (ushort)(local_618._2_2_ + 2U) >> 2;
  uVar55 = (ushort)(local_618._4_2_ + 2U) >> 2;
  uVar58 = (ushort)(local_618._6_2_ + 2U) >> 2;
  uVar61 = (ushort)((short)uStack_610 + 2U) >> 2;
  uVar63 = (ushort)(uStack_610._2_2_ + 2U) >> 2;
  uVar65 = (ushort)(uStack_610._4_2_ + 2U) >> 2;
  uVar68 = (ushort)(uStack_610._6_2_ + 2U) >> 2;
  local_708._0_4_ = CONCAT22(uVar52,uVar47);
  local_708._0_6_ = CONCAT24(uVar55,(undefined4)local_708);
  local_708 = CONCAT26(uVar58,(undefined6)local_708);
  uStack_700._0_4_ = CONCAT22(uVar63,uVar61);
  uStack_700._0_6_ = CONCAT24(uVar65,(undefined4)uStack_700);
  uStack_700 = CONCAT26(uVar68,(undefined6)uStack_700);
  local_5f8 = local_718;
  uStack_5f0 = uStack_710;
  local_5fc = 2;
  local_718._0_4_ =
       CONCAT22((ushort)(local_638._2_2_ + 2U) >> 2,(ushort)((short)local_638 + 2U) >> 2);
  local_718._0_6_ = CONCAT24((ushort)(local_638._4_2_ + 2U) >> 2,(undefined4)local_718);
  local_718 = CONCAT26((ushort)(local_638._6_2_ + 2U) >> 2,(undefined6)local_718);
  uStack_710._0_4_ =
       CONCAT22((ushort)(uStack_630._2_2_ + 2U) >> 2,(ushort)((short)uStack_630 + 2U) >> 2);
  uStack_710._0_6_ = CONCAT24((ushort)(uStack_630._4_2_ + 2U) >> 2,(undefined4)uStack_710);
  uStack_710 = CONCAT26((ushort)(uStack_630._6_2_ + 2U) >> 2,(undefined6)uStack_710);
  local_5b8 = local_708;
  uStack_5b0 = uStack_700;
  local_708._0_4_ = CONCAT22(uVar52 - 1,uVar47 - 1);
  local_708._0_6_ = CONCAT24(uVar55 - 1,(undefined4)local_708);
  local_708 = CONCAT26(uVar58 - 1,(undefined6)local_708);
  uStack_700._0_4_ = CONCAT22(uVar63 - 1,uVar61 - 1);
  uStack_700._0_6_ = CONCAT24(uVar65 - 1,(undefined4)uStack_700);
  uStack_700 = CONCAT26(uVar68 - 1,(undefined6)uStack_700);
  local_690 = in_RDI;
  local_648 = local_6e8;
  uStack_640 = uStack_6e0;
  local_638 = uVar29;
  uStack_630 = uVar30;
  local_628 = local_6e8;
  uStack_620 = uStack_6e0;
  local_618 = uVar82;
  uStack_610 = uVar28;
  local_5c8 = local_6d8;
  uStack_5c0 = uStack_6d0;
  local_48 = local_6d8;
  uStack_40 = uStack_6d0;
  local_28 = local_6e8;
  uStack_20 = uStack_6e0;
  load_coefficients(in_RDI);
  coeff0_00 = (__m128i *)(local_690 + 8);
  local_758 = extraout_XMM0_Qa;
  uStack_750 = extraout_XMM0_Qb;
  alVar83 = load_coefficients((tran_low_t *)coeff0_00);
  auVar51._8_8_ = uStack_750;
  auVar51._0_8_ = local_758;
  local_778 = (__m128i)pabsw(auVar51,auVar51);
  auVar50._8_8_ = extraout_XMM0_Qb_00;
  auVar50._0_8_ = extraout_XMM0_Qa_00;
  local_788 = (__m128i)pabsw(auVar50,auVar50);
  local_4f8 = local_778[0];
  lVar42 = local_4f8;
  uStack_4f0 = local_778[1];
  lVar43 = uStack_4f0;
  local_508 = local_708;
  uStack_500 = uStack_700;
  local_4f8._0_2_ = (short)local_778[0];
  local_4f8._2_2_ = local_778[0]._2_2_;
  local_4f8._4_2_ = local_778[0]._4_2_;
  local_4f8._6_2_ = local_778[0]._6_2_;
  uStack_4f0._0_2_ = (short)local_778[1];
  uStack_4f0._2_2_ = local_778[1]._2_2_;
  uStack_4f0._4_2_ = local_778[1]._4_2_;
  uStack_4f0._6_2_ = local_778[1]._6_2_;
  sVar48 = -(ushort)((short)local_708 < (short)local_4f8);
  sVar54 = (short)((ulong)local_708 >> 0x10);
  sVar53 = -(ushort)(sVar54 < local_4f8._2_2_);
  sVar57 = (short)((ulong)local_708 >> 0x20);
  sVar56 = -(ushort)(sVar57 < local_4f8._4_2_);
  sVar60 = (short)((ulong)local_708 >> 0x30);
  sVar59 = -(ushort)(sVar60 < local_4f8._6_2_);
  sVar62 = -(ushort)((short)uStack_700 < (short)uStack_4f0);
  sVar64 = -(ushort)((short)((ulong)uStack_700 >> 0x10) < uStack_4f0._2_2_);
  sVar67 = (short)((ulong)uStack_700 >> 0x20);
  sVar66 = -(ushort)(sVar67 < uStack_4f0._4_2_);
  sVar70 = (short)((ulong)uStack_700 >> 0x30);
  sVar69 = -(ushort)(sVar70 < uStack_4f0._6_2_);
  uStack_3cc = uStack_700._4_4_;
  local_3c8 = CONCAT44(local_3c8._4_4_,uStack_6f8);
  local_3e8 = local_708;
  uStack_3dc = uStack_700._4_4_;
  uStack_3d4 = (undefined4)((ulong)local_708 >> 0x20);
  _local_3d8 = CONCAT44(uStack_3d4,uStack_6f8);
  auVar17._4_8_ = uStack_700;
  auVar17._0_4_ = uStack_3d4;
  auVar71._0_8_ = auVar17._0_8_ << 0x20;
  auVar71._8_4_ = uStack_3e0;
  auVar71._12_4_ = uStack_700._4_4_;
  uStack_700 = auVar71._8_8_;
  local_518 = local_788[0];
  lVar40 = local_518;
  uStack_510 = local_788[1];
  lVar41 = uStack_510;
  local_528 = local_708;
  local_518._0_2_ = (short)local_788[0];
  local_518._2_2_ = local_788[0]._2_2_;
  local_518._4_2_ = local_788[0]._4_2_;
  local_518._6_2_ = local_788[0]._6_2_;
  uStack_510._0_2_ = (short)local_788[1];
  uStack_510._2_2_ = local_788[1]._2_2_;
  uStack_510._4_2_ = local_788[1]._4_2_;
  uStack_510._6_2_ = local_788[1]._6_2_;
  uStack_520._0_2_ = (short)uStack_3e0;
  uStack_520._2_2_ = (short)((uint)uStack_3e0 >> 0x10);
  sVar49 = -(ushort)((short)local_708 < (short)local_518);
  sVar54 = -(ushort)(sVar54 < local_518._2_2_);
  sVar57 = -(ushort)(sVar57 < local_518._4_2_);
  sVar60 = -(ushort)(sVar60 < local_518._6_2_);
  bVar7 = (short)uStack_520 < (short)uStack_510;
  bVar10 = uStack_520._2_2_ < uStack_510._2_2_;
  sVar67 = -(ushort)(sVar67 < uStack_510._4_2_);
  sVar70 = -(ushort)(sVar70 < uStack_510._6_2_);
  local_398 = CONCAT26(sVar59,CONCAT24(sVar56,CONCAT22(sVar53,sVar48)));
  uStack_390 = CONCAT26(sVar69,CONCAT24(sVar66,CONCAT22(sVar64,sVar62)));
  local_3a8 = CONCAT26(sVar60,CONCAT24(sVar57,CONCAT22(sVar54,sVar49)));
  uStack_3a0 = CONCAT26(sVar70,CONCAT24(sVar67,CONCAT22(-(ushort)bVar10,-(ushort)bVar7)));
  local_378 = local_398 | local_3a8;
  uStack_370 = uStack_390 | uStack_3a0;
  auVar34._8_8_ = uStack_370;
  auVar34._0_8_ = local_378;
  uStack_520 = uStack_700;
  local_518 = lVar40;
  uStack_510 = lVar41;
  local_4f8 = lVar42;
  uStack_4f0 = lVar43;
  if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar34 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (uStack_370 >> 7 & 1) == 0) && (uStack_370 >> 0xf & 1) == 0) &&
          (uStack_370 >> 0x17 & 1) == 0) && (uStack_370 >> 0x1f & 1) == 0) &&
        (uStack_370 >> 0x27 & 1) == 0) && (uStack_370 >> 0x2f & 1) == 0) &&
      (uStack_370 >> 0x37 & 1) == 0) && -1 < (long)uStack_370) {
    local_188 = local_6c8;
    uStack_180 = uStack_6c0;
    *in_stack_00000008 = local_6c8;
    in_stack_00000008[1] = uStack_6c0;
    local_190 = in_stack_00000008 + 2;
    local_1a8 = local_6c8;
    uStack_1a0 = uStack_6c0;
    *local_190 = local_6c8;
    in_stack_00000008[3] = uStack_6c0;
    local_1b0 = in_stack_00000008 + 4;
    local_1c8 = local_6c8;
    uStack_1c0 = uStack_6c0;
    *local_1b0 = local_6c8;
    in_stack_00000008[5] = uStack_6c0;
    local_1d0 = in_stack_00000008 + 6;
    local_1e8 = local_6c8;
    uStack_1e0 = uStack_6c0;
    *local_1d0 = local_6c8;
    in_stack_00000008[7] = uStack_6c0;
    local_208 = local_6c8;
    uStack_200 = uStack_6c0;
    *(undefined8 *)eob0[0] = local_6c8;
    *(undefined8 *)(eob0[0] + 8) = uStack_6c0;
    local_210 = (undefined8 *)(eob0[0] + 0x10);
    local_228 = local_6c8;
    uStack_220 = uStack_6c0;
    *local_210 = local_6c8;
    *(undefined8 *)(eob0[0] + 0x18) = uStack_6c0;
    local_230 = (undefined8 *)(eob0[0] + 0x20);
    local_248 = local_6c8;
    uStack_240 = uStack_6c0;
    *local_230 = local_6c8;
    *(undefined8 *)(eob0[0] + 0x28) = uStack_6c0;
    local_250 = (undefined8 *)(eob0[0] + 0x30);
    local_268 = local_6c8;
    uStack_260 = uStack_6c0;
    *local_250 = local_6c8;
    *(undefined8 *)(eob0[0] + 0x38) = uStack_6c0;
    uStack_3ec = uStack_710._4_4_;
    uStack_3fc = uStack_710._4_4_;
    uStack_3f4 = (undefined4)((ulong)local_718 >> 0x20);
    _local_3f8 = CONCAT44(uStack_3f4,(undefined4)local_708);
    auVar18._4_8_ = uStack_390;
    auVar18._0_4_ = uStack_3f4;
    auVar72._0_8_ = auVar18._0_8_ << 0x20;
    auVar72._8_4_ = uStack_400;
    auVar72._12_4_ = uStack_710._4_4_;
    uStack_710 = auVar72._8_8_;
    uStack_40c = uStack_720._4_4_;
    local_408 = local_718;
    uStack_41c = uStack_720._4_4_;
    _local_418 = CONCAT44(local_728._4_4_,(undefined4)local_718);
    auVar19._4_8_ = uStack_710;
    auVar19._0_4_ = local_728._4_4_;
    auVar73._0_8_ = auVar19._0_8_ << 0x20;
    auVar73._8_4_ = uStack_420;
    auVar73._12_4_ = uStack_720._4_4_;
    uStack_720 = auVar73._8_8_;
    uStack_42c = uStack_740._4_4_;
    _local_428 = CONCAT44(local_728._4_4_,(undefined4)local_738);
    uStack_43c = uStack_740._4_4_;
    uStack_434 = (undefined4)((ulong)local_748 >> 0x20);
    _local_438 = CONCAT44(uStack_434,(undefined4)local_738);
    auVar20._4_8_ = uStack_720;
    auVar20._0_4_ = uStack_434;
    auVar74._0_8_ = auVar20._0_8_ << 0x20;
    auVar74._8_4_ = uStack_440;
    auVar74._12_4_ = uStack_740._4_4_;
    uStack_740 = auVar74._8_8_;
    uStack_44c = uStack_730._4_4_;
    _local_448 = CONCAT44(uStack_434,(undefined4)local_728);
    local_468 = local_738;
    uStack_45c = uStack_730._4_4_;
    uStack_454 = (undefined4)((ulong)local_738 >> 0x20);
    _local_458 = CONCAT44(uStack_454,(undefined4)local_728);
    auVar21._4_8_ = uStack_740;
    auVar21._0_4_ = uStack_454;
    auVar75._0_8_ = auVar21._0_8_ << 0x20;
    auVar75._8_4_ = uStack_460;
    auVar75._12_4_ = uStack_730._4_4_;
    uStack_730 = auVar75._8_8_;
  }
  else {
    auVar22._4_8_ = uStack_390;
    auVar22._0_4_ = local_728._4_4_;
    auVar76._0_8_ = auVar22._0_8_ << 0x20;
    auVar76._8_4_ = (undefined4)uStack_720;
    auVar76._12_4_ = uStack_720._4_4_;
    uVar82 = auVar76._8_8_;
    plVar46 = &local_748;
    alVar83[0] = (longlong)plVar46;
    quant_00[1] = (longlong)in_R8;
    quant_00[0] = (longlong)in_RCX;
    local_768 = extraout_XMM0_Qa_00;
    uStack_760 = extraout_XMM0_Qb_00;
    calculate_qcoeff_64x64(&local_778,alVar83,quant_00,in_R9);
    uStack_46c = uStack_710._4_4_;
    local_468 = CONCAT44(local_468._4_4_,(undefined4)local_708);
    uStack_47c = uStack_710._4_4_;
    uStack_474 = (undefined4)((ulong)local_718 >> 0x20);
    _local_478 = CONCAT44(uStack_474,(undefined4)local_708);
    auVar23._4_8_ = uVar82;
    auVar23._0_4_ = uStack_474;
    auVar77._0_8_ = auVar23._0_8_ << 0x20;
    auVar77._8_4_ = uStack_480;
    auVar77._12_4_ = uStack_710._4_4_;
    uStack_710 = auVar77._8_8_;
    uStack_48c = uStack_720._4_4_;
    local_488 = local_718;
    uStack_49c = uStack_720._4_4_;
    uStack_494 = (undefined4)((ulong)local_728 >> 0x20);
    _local_498 = CONCAT44(uStack_494,(undefined4)local_718);
    auVar24._4_8_ = uStack_710;
    auVar24._0_4_ = uStack_494;
    auVar78._0_8_ = auVar24._0_8_ << 0x20;
    auVar78._8_4_ = uStack_4a0;
    auVar78._12_4_ = uStack_720._4_4_;
    uStack_720 = auVar78._8_8_;
    uStack_4ac = uStack_740._4_4_;
    _local_4a8 = CONCAT44(uStack_494,(undefined4)local_738);
    local_4c8 = local_748;
    uStack_4bc = uStack_740._4_4_;
    uStack_4b4 = (undefined4)((ulong)local_748 >> 0x20);
    _local_4b8 = CONCAT44(uStack_4b4,(undefined4)local_738);
    auVar25._4_8_ = uStack_720;
    auVar25._0_4_ = uStack_4b4;
    auVar79._0_8_ = auVar25._0_8_ << 0x20;
    auVar79._8_4_ = uStack_4c0;
    auVar79._12_4_ = uStack_740._4_4_;
    uStack_740 = auVar79._8_8_;
    round_00[1] = extraout_RDX;
    round_00[0] = (longlong)plVar46;
    quant_01[1] = (longlong)in_R8;
    quant_01[0] = (longlong)in_RCX;
    in_stack_fffffffffffff818 = plVar46;
    calculate_qcoeff_64x64(&local_788,round_00,quant_01,in_R9);
    local_f8 = local_778[0];
    lStack_f0 = local_778[1];
    local_108 = local_758;
    uStack_100 = uStack_750;
    auVar38._8_8_ = uStack_750;
    auVar38._0_8_ = local_758;
    auVar50 = psignw((undefined1  [16])local_778,auVar38);
    local_118 = local_788[0];
    lStack_110 = local_788[1];
    local_128 = local_768;
    uStack_120 = uStack_760;
    auVar37._8_8_ = uStack_760;
    auVar37._0_8_ = local_768;
    auVar51 = psignw((undefined1  [16])local_788,auVar37);
    local_778[0] = auVar50._0_8_;
    local_778[1] = auVar50._8_8_;
    local_88 = CONCAT26(sVar59,CONCAT24(sVar56,CONCAT22(sVar53,sVar48)));
    uStack_80 = CONCAT26(sVar69,CONCAT24(sVar66,CONCAT22(sVar64,sVar62)));
    local_78 = local_778[0];
    uStack_70 = local_778[1];
    local_778[1] = local_778[1] & uStack_80;
    local_778[0] = local_778[0] & local_88;
    local_788[0] = auVar51._0_8_;
    local_788[1] = auVar51._8_8_;
    local_a8 = CONCAT26(sVar60,CONCAT24(sVar57,CONCAT22(sVar54,sVar49)));
    uStack_a0 = CONCAT26(sVar70,CONCAT24(sVar67,CONCAT22(-(ushort)bVar10,-(ushort)bVar7)));
    local_98 = local_788[0];
    lStack_90 = local_788[1];
    auVar39._8_8_ = uStack_a0;
    auVar39._0_8_ = local_a8;
    local_788 = (__m128i)(auVar51 & auVar39);
    coeff_vals[1] = (longlong)plVar46;
    coeff_vals[0] = (longlong)in_stack_00000008;
    uVar82 = uStack_a0;
    store_coefficients(coeff_vals,coeff_ptr_00);
    coeff_vals_00[0] = in_stack_00000008 + 4;
    coeff_vals_00[1] = (longlong)plVar46;
    store_coefficients(coeff_vals_00,coeff_ptr_01);
    auVar26._4_8_ = uVar82;
    auVar26._0_4_ = local_738._4_4_;
    auVar80._0_8_ = auVar26._0_8_ << 0x20;
    auVar80._8_4_ = (undefined4)uStack_730;
    auVar80._12_4_ = uStack_730._4_4_;
    uVar82 = auVar80._8_8_;
    qcoeff[1] = (longlong)plVar46;
    qcoeff[0] = eob0[0];
    dequant_00[1] = (longlong)in_RCX;
    dequant_00[0] = extraout_RDX_00;
    zero_02[1] = (longlong)in_R9;
    zero_02[0] = (longlong)in_R8;
    calculate_dqcoeff_and_store_64x64
              (qcoeff,dequant_00,zero_02,(tran_low_t *)in_stack_fffffffffffff818);
    uStack_4cc = uStack_730._4_4_;
    local_4c8 = CONCAT44(local_4c8._4_4_,(undefined4)local_728);
    local_4e8 = local_738;
    uStack_4dc = uStack_730._4_4_;
    uStack_4d4 = (undefined4)((ulong)local_738 >> 0x20);
    _local_4d8 = CONCAT44(uStack_4d4,(undefined4)local_728);
    auVar27._4_8_ = uVar82;
    auVar27._0_4_ = uStack_4d4;
    auVar81._0_8_ = auVar27._0_8_ << 0x20;
    auVar81._8_4_ = uStack_4e0;
    auVar81._12_4_ = uStack_730._4_4_;
    uStack_730 = auVar81._8_8_;
    qcoeff_00[0] = eob0[0] + 0x20;
    qcoeff_00[1] = (longlong)plVar46;
    dequant_01[1] = (longlong)in_RCX;
    dequant_01[0] = extraout_RDX_01;
    zero_03[1] = (longlong)in_R9;
    zero_03[0] = (longlong)in_R8;
    calculate_dqcoeff_and_store_64x64
              (qcoeff_00,dequant_01,zero_03,(tran_low_t *)in_stack_fffffffffffff818);
    coeff0_00 = &local_778;
    in_RSI = &local_788;
    zero_00[1] = in_stack_fffffffffffff830;
    zero_00[0] = in_stack_fffffffffffff828;
    zbin_mask0[1] = 0;
    zbin_mask0[0] = all_zero[0];
    zbin_mask1[1] = (longlong)in_R9;
    zbin_mask1[0] = (longlong)in_R8;
    scan_for_eob(coeff0_00,in_RSI,zbin_mask0,zbin_mask1,(int16_t *)in_stack_fffffffffffff818,
                 in_stack_fffffffffffff820,zero_00);
    local_7c8 = extraout_XMM0_Qa_01;
    uStack_7c0 = extraout_XMM0_Qb_01;
  }
  for (local_6ec = 0x10; local_6ec < 0x400; local_6ec = local_6ec + 0x10) {
    load_coefficients(local_690 + local_6ec);
    lVar45 = (long)local_6ec;
    coeff0_00 = (__m128i *)(local_690 + lVar45 + 8);
    local_758 = extraout_XMM0_Qa_02;
    uStack_750 = extraout_XMM0_Qb_02;
    alVar83 = load_coefficients((tran_low_t *)coeff0_00);
    round_01[1] = alVar83[1];
    auVar32._8_8_ = uStack_750;
    auVar32._0_8_ = local_758;
    local_778 = (__m128i)pabsw(auVar32,auVar32);
    auVar31._8_8_ = extraout_XMM0_Qb_03;
    auVar31._0_8_ = extraout_XMM0_Qa_03;
    local_788 = (__m128i)pabsw(auVar31,auVar31);
    local_538 = local_778[0];
    lVar42 = local_538;
    uStack_530 = local_778[1];
    lVar43 = uStack_530;
    local_548 = local_708;
    uVar82 = local_548;
    uStack_540 = uStack_700;
    uVar28 = uStack_540;
    local_538._0_2_ = (short)local_778[0];
    local_538._2_2_ = local_778[0]._2_2_;
    local_538._4_2_ = local_778[0]._4_2_;
    local_538._6_2_ = local_778[0]._6_2_;
    uStack_530._0_2_ = (short)local_778[1];
    uStack_530._2_2_ = local_778[1]._2_2_;
    uStack_530._4_2_ = local_778[1]._4_2_;
    uStack_530._6_2_ = local_778[1]._6_2_;
    local_548._0_2_ = (short)local_708;
    local_548._2_2_ = (short)((ulong)local_708 >> 0x10);
    local_548._4_2_ = (short)((ulong)local_708 >> 0x20);
    local_548._6_2_ = (short)((ulong)local_708 >> 0x30);
    uStack_540._0_2_ = (short)uStack_700;
    uStack_540._2_2_ = (short)((ulong)uStack_700 >> 0x10);
    uStack_540._4_2_ = (short)((ulong)uStack_700 >> 0x20);
    uStack_540._6_2_ = (short)((ulong)uStack_700 >> 0x30);
    bVar7 = (short)local_548 < (short)local_538;
    bVar1 = local_548._2_2_ < local_538._2_2_;
    bVar3 = local_548._4_2_ < local_538._4_2_;
    bVar5 = local_548._6_2_ < local_538._6_2_;
    bVar8 = (short)uStack_540 < (short)uStack_530;
    bVar11 = uStack_540._2_2_ < uStack_530._2_2_;
    bVar13 = uStack_540._4_2_ < uStack_530._4_2_;
    bVar15 = uStack_540._6_2_ < uStack_530._6_2_;
    local_558 = local_788[0];
    lVar40 = local_558;
    uStack_550 = local_788[1];
    lVar41 = uStack_550;
    local_568 = local_708;
    uStack_560 = uStack_700;
    local_558._0_2_ = (short)local_788[0];
    local_558._2_2_ = local_788[0]._2_2_;
    local_558._4_2_ = local_788[0]._4_2_;
    local_558._6_2_ = local_788[0]._6_2_;
    uStack_550._0_2_ = (short)local_788[1];
    uStack_550._2_2_ = local_788[1]._2_2_;
    uStack_550._4_2_ = local_788[1]._4_2_;
    uStack_550._6_2_ = local_788[1]._6_2_;
    bVar10 = (short)local_548 < (short)local_558;
    bVar2 = local_548._2_2_ < local_558._2_2_;
    bVar4 = local_548._4_2_ < local_558._4_2_;
    bVar6 = local_548._6_2_ < local_558._6_2_;
    bVar9 = (short)uStack_540 < (short)uStack_550;
    bVar12 = uStack_540._2_2_ < uStack_550._2_2_;
    bVar14 = uStack_540._4_2_ < uStack_550._4_2_;
    bVar16 = uStack_540._6_2_ < uStack_550._6_2_;
    local_3b8 = CONCAT26(-(ushort)bVar5,
                         CONCAT24(-(ushort)bVar3,CONCAT22(-(ushort)bVar1,-(ushort)bVar7)));
    uStack_3b0 = CONCAT26(-(ushort)bVar15,
                          CONCAT24(-(ushort)bVar13,CONCAT22(-(ushort)bVar11,-(ushort)bVar8)));
    local_3c8 = CONCAT26(-(ushort)bVar6,
                         CONCAT24(-(ushort)bVar4,CONCAT22(-(ushort)bVar2,-(ushort)bVar10)));
    uStack_3c0 = CONCAT26(-(ushort)bVar16,
                          CONCAT24(-(ushort)bVar14,CONCAT22(-(ushort)bVar12,-(ushort)bVar9)));
    local_388 = local_3b8 | local_3c8;
    uStack_380 = uStack_3b0 | uStack_3c0;
    auVar33._8_8_ = uStack_380;
    auVar33._0_8_ = local_388;
    local_558 = lVar40;
    uStack_550 = lVar41;
    local_548 = uVar82;
    uStack_540 = uVar28;
    local_538 = lVar42;
    uStack_530 = lVar43;
    if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (uStack_380 >> 7 & 1) == 0) && (uStack_380 >> 0xf & 1) == 0) &&
            (uStack_380 >> 0x17 & 1) == 0) && (uStack_380 >> 0x1f & 1) == 0) &&
          (uStack_380 >> 0x27 & 1) == 0) && (uStack_380 >> 0x2f & 1) == 0) &&
        (uStack_380 >> 0x37 & 1) == 0) && -1 < (long)uStack_380) {
      local_270 = (undefined8 *)((long)in_stack_00000008 + (long)local_6ec * 4);
      local_288 = local_6c8;
      uStack_280 = uStack_6c0;
      *local_270 = local_6c8;
      local_270[1] = uStack_6c0;
      local_290 = (undefined8 *)((long)in_stack_00000008 + (long)local_6ec * 4 + 0x10);
      local_2a8 = local_6c8;
      uStack_2a0 = uStack_6c0;
      *local_290 = local_6c8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_6ec * 4 + 0x18) = uStack_6c0;
      local_2b0 = (undefined8 *)((long)in_stack_00000008 + (long)local_6ec * 4 + 0x20);
      local_2c8 = local_6c8;
      uStack_2c0 = uStack_6c0;
      *local_2b0 = local_6c8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_6ec * 4 + 0x28) = uStack_6c0;
      local_2d0 = (undefined8 *)((long)in_stack_00000008 + (long)local_6ec * 4 + 0x30);
      local_2e8 = local_6c8;
      uStack_2e0 = uStack_6c0;
      *local_2d0 = local_6c8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_6ec * 4 + 0x38) = uStack_6c0;
      local_2f0 = (undefined8 *)(eob0[0] + (long)local_6ec * 4);
      local_308 = local_6c8;
      uStack_300 = uStack_6c0;
      *local_2f0 = local_6c8;
      local_2f0[1] = uStack_6c0;
      lVar45 = eob0[0] + (long)local_6ec * 4;
      local_310 = (undefined8 *)(lVar45 + 0x10);
      local_328 = local_6c8;
      uStack_320 = uStack_6c0;
      *local_310 = local_6c8;
      *(undefined8 *)(lVar45 + 0x18) = uStack_6c0;
      lVar45 = eob0[0] + (long)local_6ec * 4;
      local_330 = (undefined8 *)(lVar45 + 0x20);
      local_348 = local_6c8;
      uStack_340 = uStack_6c0;
      *local_330 = local_6c8;
      *(undefined8 *)(lVar45 + 0x28) = uStack_6c0;
      lVar45 = eob0[0] + (long)local_6ec * 4;
      local_350 = (undefined8 *)(lVar45 + 0x30);
      local_368 = local_6c8;
      uStack_360 = uStack_6c0;
      *local_350 = local_6c8;
      *(undefined8 *)(lVar45 + 0x38) = uStack_6c0;
    }
    else {
      round_01[0] = (longlong)&local_748;
      quant_02[1] = (longlong)in_R8;
      quant_02[0] = lVar45;
      local_768 = extraout_XMM0_Qa_03;
      uStack_760 = extraout_XMM0_Qb_03;
      calculate_qcoeff_64x64(&local_778,round_01,quant_02,in_R9);
      plVar46 = &local_748;
      round_02[1] = extraout_RDX_02;
      round_02[0] = (longlong)plVar46;
      quant_03[1] = (longlong)in_R8;
      quant_03[0] = lVar45;
      calculate_qcoeff_64x64(&local_788,round_02,quant_03,in_R9);
      local_138 = local_778[0];
      lStack_130 = local_778[1];
      local_148 = local_758;
      uStack_140 = uStack_750;
      auVar36._8_8_ = uStack_750;
      auVar36._0_8_ = local_758;
      auVar50 = psignw((undefined1  [16])local_778,auVar36);
      local_158 = local_788[0];
      lStack_150 = local_788[1];
      local_168 = local_768;
      uStack_160 = uStack_760;
      auVar35._8_8_ = uStack_760;
      auVar35._0_8_ = local_768;
      auVar51 = psignw((undefined1  [16])local_788,auVar35);
      local_778[0] = auVar50._0_8_;
      local_778[1] = auVar50._8_8_;
      local_c8 = CONCAT26(-(ushort)bVar5,
                          CONCAT24(-(ushort)bVar3,CONCAT22(-(ushort)bVar1,-(ushort)bVar7)));
      uStack_c0 = CONCAT26(-(ushort)bVar15,
                           CONCAT24(-(ushort)bVar13,CONCAT22(-(ushort)bVar11,-(ushort)bVar8)));
      local_b8 = local_778[0];
      uStack_b0 = local_778[1];
      local_778[1] = local_778[1] & uStack_c0;
      local_778[0] = local_778[0] & local_c8;
      local_788[0] = auVar51._0_8_;
      local_788[1] = auVar51._8_8_;
      local_e8 = CONCAT26(-(ushort)bVar6,
                          CONCAT24(-(ushort)bVar4,CONCAT22(-(ushort)bVar2,-(ushort)bVar10)));
      uStack_e0 = CONCAT26(-(ushort)bVar16,
                           CONCAT24(-(ushort)bVar14,CONCAT22(-(ushort)bVar12,-(ushort)bVar9)));
      local_d8 = local_788[0];
      uStack_d0 = local_788[1];
      local_788[1] = local_788[1] & uStack_e0;
      local_788[0] = local_788[0] & local_e8;
      coeff_vals_01[0] = (long)in_stack_00000008 + (long)local_6ec * 4;
      coeff_vals_01[1] = (longlong)plVar46;
      store_coefficients(coeff_vals_01,coeff_ptr_02);
      coeff_vals_02[0] = (long)in_stack_00000008 + (long)local_6ec * 4 + 0x20;
      coeff_vals_02[1] = (longlong)plVar46;
      store_coefficients(coeff_vals_02,coeff_ptr_03);
      qcoeff_01[0] = eob0[0] + (long)local_6ec * 4;
      qcoeff_01[1] = (longlong)plVar46;
      dequant_02[1] = lVar45;
      dequant_02[0] = extraout_RDX_03;
      zero_04[1] = (longlong)in_R9;
      zero_04[0] = (longlong)in_R8;
      calculate_dqcoeff_and_store_64x64
                (qcoeff_01,dequant_02,zero_04,(tran_low_t *)in_stack_fffffffffffff818);
      qcoeff_02[0] = eob0[0] + 0x20 + (long)local_6ec * 4;
      qcoeff_02[1] = (longlong)plVar46;
      dequant_03[1] = lVar45;
      dequant_03[0] = extraout_RDX_04;
      zero_05[1] = (longlong)in_R9;
      zero_05[0] = (longlong)in_R8;
      calculate_dqcoeff_and_store_64x64
                (qcoeff_02,dequant_03,zero_05,(tran_low_t *)in_stack_fffffffffffff818);
      coeff0_00 = &local_778;
      in_RSI = &local_788;
      zero_01[1] = in_stack_fffffffffffff830;
      zero_01[0] = in_stack_fffffffffffff828;
      zbin_mask0_00[1]._0_4_ = local_6ec;
      zbin_mask0_00[0] = all_zero[0];
      zbin_mask0_00[1]._4_4_ = 0;
      zbin_mask1_00[1] = (longlong)in_R9;
      zbin_mask1_00[0] = (longlong)in_R8;
      scan_for_eob(coeff0_00,in_RSI,zbin_mask0_00,zbin_mask1_00,(int16_t *)in_stack_fffffffffffff818
                   ,in_stack_fffffffffffff820,zero_01);
      local_58 = local_7c8;
      uVar82 = local_58;
      uStack_50 = uStack_7c0;
      uVar28 = uStack_50;
      local_58._0_2_ = (short)local_7c8;
      local_58._2_2_ = (short)((ulong)local_7c8 >> 0x10);
      local_58._4_2_ = (short)((ulong)local_7c8 >> 0x20);
      local_58._6_2_ = (short)((ulong)local_7c8 >> 0x30);
      uStack_50._0_2_ = (short)uStack_7c0;
      uStack_50._2_2_ = (short)((ulong)uStack_7c0 >> 0x10);
      uStack_50._4_2_ = (short)((ulong)uStack_7c0 >> 0x20);
      uStack_50._6_2_ = (short)((ulong)uStack_7c0 >> 0x30);
      local_68 = (short)extraout_XMM0_Qa_04;
      sStack_66 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x10);
      sStack_64 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x20);
      sStack_62 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x30);
      sStack_60 = (short)extraout_XMM0_Qb_04;
      sStack_5e = (short)((ulong)extraout_XMM0_Qb_04 >> 0x10);
      sStack_5c = (short)((ulong)extraout_XMM0_Qb_04 >> 0x20);
      sStack_5a = (short)((ulong)extraout_XMM0_Qb_04 >> 0x30);
      local_7c8 = CONCAT26((ushort)(local_58._6_2_ < sStack_62) * sStack_62 |
                           (ushort)(local_58._6_2_ >= sStack_62) * local_58._6_2_,
                           CONCAT24((ushort)(local_58._4_2_ < sStack_64) * sStack_64 |
                                    (ushort)(local_58._4_2_ >= sStack_64) * local_58._4_2_,
                                    CONCAT22((ushort)(local_58._2_2_ < sStack_66) * sStack_66 |
                                             (ushort)(local_58._2_2_ >= sStack_66) * local_58._2_2_,
                                             (ushort)((short)local_58 < local_68) * local_68 |
                                             (ushort)((short)local_58 >= local_68) * (short)local_58
                                            )));
      uStack_7c0 = CONCAT26((ushort)(uStack_50._6_2_ < sStack_5a) * sStack_5a |
                            (ushort)(uStack_50._6_2_ >= sStack_5a) * uStack_50._6_2_,
                            CONCAT24((ushort)(uStack_50._4_2_ < sStack_5c) * sStack_5c |
                                     (ushort)(uStack_50._4_2_ >= sStack_5c) * uStack_50._4_2_,
                                     CONCAT22((ushort)(uStack_50._2_2_ < sStack_5e) * sStack_5e |
                                              (ushort)(uStack_50._2_2_ >= sStack_5e) *
                                              uStack_50._2_2_,
                                              (ushort)((short)uStack_50 < sStack_60) * sStack_60 |
                                              (ushort)((short)uStack_50 >= sStack_60) *
                                              (short)uStack_50)));
      in_stack_fffffffffffff828 = extraout_XMM0_Qa_04;
      in_stack_fffffffffffff830 = extraout_XMM0_Qb_04;
      local_58 = uVar82;
      uStack_50 = uVar28;
    }
  }
  eob_00[1] = (longlong)in_RSI;
  eob_00[0] = (longlong)coeff0_00;
  iVar44 = accumulate_eob(eob_00);
  *(int16_t *)eob[0] = iVar44;
  return;
}

Assistant:

void aom_quantize_b_64x64_ssse3(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i two = _mm_set1_epi16(2);
  int index;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, all_zero;
  __m128i eob = zero, eob0;

  (void)scan;
  (void)n_coeffs;

  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, two);
  round = _mm_add_epi16(round, two);
  zbin = _mm_srli_epi16(zbin, 2);
  round = _mm_srli_epi16(round, 2);
  zbin = _mm_sub_epi16(zbin, one);
  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_64x64(&qcoeff0, round, quant, &shift);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_64x64(&qcoeff1, round, quant, &shift);

    // Reinsert signs.
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs.
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_64x64(qcoeff0, dequant, zero, dqcoeff_ptr);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_64x64(qcoeff1, dequant, zero, dqcoeff_ptr + 8);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < 1024; index += 16) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      continue;
    }
    calculate_qcoeff_64x64(&qcoeff0, round, quant, &shift);
    calculate_qcoeff_64x64(&qcoeff1, round, quant, &shift);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_64x64(qcoeff0, dequant, zero,
                                      dqcoeff_ptr + index);
    calculate_dqcoeff_and_store_64x64(qcoeff1, dequant, zero,
                                      dqcoeff_ptr + 8 + index);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}